

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O3

SRC_ERROR zoh_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  float *pfVar4;
  float *pfVar5;
  SRC_ERROR SVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  lVar7 = data->input_frames;
  if (lVar7 < 1) {
    return SRC_ERR_NO_ERROR;
  }
  pvVar3 = state->private_data;
  if (pvVar3 == (void *)0x0) {
    return SRC_ERR_NO_PRIVATE;
  }
  uVar2 = state->channels;
  lVar12 = (long)(int)uVar2;
  uVar13 = (ulong)uVar2;
  if (*(char *)((long)pvVar3 + 4) == '\0') {
    if (0 < (int)uVar2) {
      pfVar4 = data->data_in;
      lVar8 = *(long *)((long)pvVar3 + 0x28);
      uVar10 = 0;
      do {
        *(float *)(lVar8 + uVar10 * 4) = pfVar4[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
    }
    *(undefined1 *)((long)pvVar3 + 4) = 1;
  }
  lVar7 = lVar7 * lVar12;
  *(long *)((long)pvVar3 + 8) = lVar7;
  lVar8 = data->output_frames * lVar12;
  *(long *)((long)pvVar3 + 0x18) = lVar8;
  *(undefined8 *)((long)pvVar3 + 0x20) = 0;
  *(undefined8 *)((long)pvVar3 + 0x10) = 0;
  dVar1 = state->last_ratio;
  SVar6 = SRC_ERR_BAD_INTERNAL_STATE;
  if ((0.00390625 <= dVar1) && (dVar1 <= 256.0)) {
    dVar14 = state->last_position;
    dVar16 = dVar1;
    if (1.0 <= dVar14) {
      lVar11 = 0;
    }
    else {
      lVar11 = 0;
      do {
        if ((lVar8 <= lVar11) || ((double)lVar7 <= (double)(int)uVar2 * dVar14 + 0.0)) break;
        if ((0 < lVar8) && (1e-20 < ABS(dVar1 - data->src_ratio))) {
          dVar16 = ((data->src_ratio - dVar1) * (double)lVar11) / (double)lVar8 + dVar1;
        }
        if (0 < (int)uVar2) {
          lVar9 = *(long *)((long)pvVar3 + 0x28);
          pfVar4 = data->data_out;
          uVar10 = 0;
          do {
            pfVar4[lVar11 + uVar10] = *(float *)(lVar9 + uVar10 * 4);
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
          lVar11 = lVar11 + uVar10;
          *(long *)((long)pvVar3 + 0x20) = lVar11;
        }
        dVar14 = dVar14 + 1.0 / dVar16;
      } while (dVar14 < 1.0);
    }
    dVar15 = dVar14 - (double)(int)ROUND(dVar14);
    dVar15 = (double)(~-(ulong)(dVar15 < 0.0) & (ulong)dVar15 |
                     (ulong)(dVar15 + 1.0) & -(ulong)(dVar15 < 0.0));
    lVar9 = (long)(int)((int)ROUND(dVar14 - dVar15) * uVar2);
    if (lVar11 < lVar8) {
      do {
        if ((double)lVar7 < (double)(int)uVar2 * dVar15 + (double)lVar9) break;
        if ((0 < lVar8) && (1e-20 < ABS(dVar1 - data->src_ratio))) {
          dVar16 = ((data->src_ratio - dVar1) * (double)lVar11) / (double)lVar8 + dVar1;
        }
        if (0 < (int)uVar2) {
          pfVar4 = data->data_in;
          pfVar5 = data->data_out;
          uVar10 = 0;
          do {
            pfVar5[lVar11 + uVar10] = pfVar4[(lVar9 - lVar12) + uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar2 != uVar10);
          lVar11 = lVar11 + uVar10;
          *(long *)((long)pvVar3 + 0x20) = lVar11;
        }
        dVar14 = dVar15 + 1.0 / dVar16;
        dVar15 = dVar14 - (double)(int)ROUND(dVar14);
        dVar15 = (double)(~-(ulong)(dVar15 < 0.0) & (ulong)dVar15 |
                         (ulong)(dVar15 + 1.0) & -(ulong)(dVar15 < 0.0));
        lVar9 = lVar9 + (int)((int)ROUND(dVar14 - dVar15) * uVar2);
      } while (lVar11 < lVar8);
    }
    if (lVar9 - lVar7 != 0 && lVar7 <= lVar9) {
      dVar15 = dVar15 + (double)((lVar9 - lVar7) / lVar12);
      lVar9 = lVar7;
    }
    *(long *)((long)pvVar3 + 0x10) = lVar9;
    state->last_position = dVar15;
    if (0 < (int)uVar2 && 0 < lVar9) {
      pfVar4 = data->data_in;
      lVar7 = *(long *)((long)pvVar3 + 0x28);
      uVar10 = 0;
      do {
        *(float *)(lVar7 + uVar10 * 4) = pfVar4[(lVar9 - lVar12) + uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
    }
    state->last_ratio = dVar16;
    data->input_frames_used = lVar9 / lVar12;
    data->output_frames_gen = lVar11 / lVar12;
    SVar6 = SRC_ERR_NO_ERROR;
  }
  return SVar6;
}

Assistant:

static SRC_ERROR
zoh_vari_process (SRC_STATE *state, SRC_DATA *data)
{	ZOH_DATA 	*priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (ZOH_DATA*) state->private_data ;

	if (!priv->dirty)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->dirty = true ;
		} ;

	priv->in_count = data->input_frames * state->channels ;
	priv->out_count = data->output_frames * state->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = state->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + state->channels * input_index >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = priv->last_value [ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += state->channels * psf_lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + state->channels * input_index <= priv->in_count)
	{
		if (priv->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = state->last_ratio + priv->out_gen * (data->src_ratio - state->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < state->channels ; ch++)
		{	data->data_out [priv->out_gen] = data->data_in [priv->in_used - state->channels + ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += state->channels * psf_lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / state->channels ;
		priv->in_used = priv->in_count ;
		} ;

	state->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < state->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - state->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / state->channels ;
	data->output_frames_gen = priv->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}